

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat.h
# Opt level: O0

bool __thiscall
wasm::analysis::Flat<unsigned_int>::Element::operator==(Element *this,Element *other)

{
  uint uVar1;
  bool bVar2;
  uint *puVar3;
  bool local_22;
  Element *other_local;
  Element *this_local;
  
  bVar2 = isBottom(this);
  if ((bVar2) && (bVar2 = isBottom(other), bVar2)) {
    return true;
  }
  bVar2 = isTop(this);
  if ((bVar2) && (bVar2 = isTop(other), bVar2)) {
    return true;
  }
  puVar3 = getVal(this);
  local_22 = false;
  if (puVar3 != (uint *)0x0) {
    puVar3 = getVal(other);
    local_22 = false;
    if (puVar3 != (uint *)0x0) {
      puVar3 = getVal(this);
      uVar1 = *puVar3;
      puVar3 = getVal(other);
      local_22 = uVar1 == *puVar3;
    }
  }
  return local_22;
}

Assistant:

bool operator==(const Element& other) const noexcept {
      return ((isBottom() && other.isBottom()) || (isTop() && other.isTop()) ||
              (getVal() && other.getVal() && *getVal() == *other.getVal()));
    }